

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::HierarchyInstantiationSyntax::getChild
          (HierarchyInstantiationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  Info *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  ConstTokenOrSyntax *in_stack_ffffffffffffffa0;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff90;
    token._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x721403,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x68),in_stack_ffffffffffffff88);
    break;
  case 4:
    token_00.info = in_stack_ffffffffffffff90;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x721488,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax HierarchyInstantiationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return type;
        case 2: return parameters;
        case 3: return &instances;
        case 4: return semi;
        default: return nullptr;
    }
}